

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_BoxArray.cpp
# Opt level: O1

void __thiscall amrex::BoxArray::BoxArray(BoxArray *this,BoxArray *rhs,BATransformer *trans)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  long lVar2;
  BATransformer *pBVar3;
  BoxArray *pBVar4;
  IntVect IVar5;
  IntVect IVar6;
  IntVect local_30;
  
  pBVar3 = trans;
  pBVar4 = this;
  for (lVar2 = 0x12; lVar2 != 0; lVar2 = lVar2 + -1) {
    (pBVar4->m_bat).m_bat_type = pBVar3->m_bat_type;
    pBVar3 = (BATransformer *)&pBVar3->m_op;
    pBVar4 = (BoxArray *)&(pBVar4->m_bat).m_op;
  }
  (this->m_ref).super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (rhs->m_ref).super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var1 = (rhs->m_ref).super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  (this->m_ref).super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  (this->m_simplified_list).super___shared_ptr<amrex::BoxList,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->m_simplified_list).super___shared_ptr<amrex::BoxList,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  IVar5 = BATransformer::coarsen_ratio(&rhs->m_bat);
  IVar6 = BATransformer::coarsen_ratio(trans);
  local_30.vect[2] = IVar6.vect[2] * IVar5.vect[2];
  local_30.vect._0_8_ =
       (ulong)(uint)(IVar6.vect[0] * IVar5.vect[0]) |
       (IVar6.vect._0_8_ >> 0x20) * (IVar5.vect._0_8_ & 0xffffffff00000000);
  BATransformer::set_coarsen_ratio(&this->m_bat,&local_30);
  return;
}

Assistant:

BoxArray::BoxArray (const BoxArray& rhs, const BATransformer& trans)
    :
    m_bat(trans),
    m_ref(rhs.m_ref)
{
    BL_ASSERT(rhs.ixType().cellCentered());  // rhs must be cell-centered.
    m_bat.set_coarsen_ratio(rhs.crseRatio() * trans.coarsen_ratio());
}